

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::Curiosity::Curiosity
          (Curiosity *this,ChSystem *system,CuriosityChassisType chassis_type,
          CuriosityWheelType wheel_type)

{
  shared_ptr<chrono::ChMaterialSurface> local_58;
  shared_ptr<chrono::ChMaterialSurface> local_48 [2];
  ChContactMethod local_24;
  CuriosityWheelType local_20;
  ChContactMethod contact_method;
  CuriosityWheelType wheel_type_local;
  CuriosityChassisType chassis_type_local;
  ChSystem *system_local;
  Curiosity *this_local;
  
  this->m_system = system;
  this->m_initialized = false;
  local_20 = wheel_type;
  contact_method = chassis_type;
  _wheel_type_local = system;
  system_local = (ChSystem *)this;
  std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&this->m_chassis);
  std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::array(&this->m_wheels);
  std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::array(&this->m_rockers);
  std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::array(&this->m_bogies);
  std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::array
            (&this->m_rocker_uprights);
  std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::array
            (&this->m_bogie_uprights);
  std::shared_ptr<chrono::curiosity::CuriosityDifferentialBar>::shared_ptr(&this->m_diff_bar);
  std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::array
            (&this->m_diff_links);
  std::shared_ptr<chrono::ChLinkLockRevolute>::shared_ptr(&this->m_diff_joint);
  std::array<std::shared_ptr<chrono::ChLinkLockRevolute>,_2UL>::array(&this->m_rocker_joints);
  std::array<std::shared_ptr<chrono::ChLinkLockRevolute>,_2UL>::array(&this->m_bogie_joints);
  std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_2UL>::array(&this->m_rocker_motors);
  std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_2UL>::array(&this->m_bogie_motors);
  std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::array(&this->m_rocker_motor_funcs);
  std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::array(&this->m_bogie_motor_funcs);
  std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::array(&this->m_drive_motors);
  std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::array(&this->m_drive_motor_funcs);
  std::array<std::shared_ptr<chrono::ChShaft>,_6UL>::array(&this->m_drive_shafts);
  std::shared_ptr<chrono::curiosity::CuriosityDriver>::shared_ptr(&this->m_driver);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_default_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_wheel_material);
  local_24 = (**(code **)(*(long *)this->m_system + 0x178))();
  if (local_24 == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
  }
  DefaultContactMaterial((curiosity *)local_48,local_24);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_default_material,local_48);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(local_48);
  DefaultContactMaterial((curiosity *)&local_58,local_24);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_wheel_material,&local_58);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_58);
  Create(this,contact_method,local_20);
  return;
}

Assistant:

Curiosity::Curiosity(ChSystem* system, CuriosityChassisType chassis_type, CuriosityWheelType wheel_type)
    : m_system(system), m_initialized(false) {
    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    auto contact_method = m_system->GetContactMethod();
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials
    m_default_material = DefaultContactMaterial(contact_method);
    m_wheel_material = DefaultContactMaterial(contact_method);

    Create(chassis_type, wheel_type);
}